

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Identifier __thiscall soul::StructuralParser::parseIdentifier(StructuralParser *this)

{
  Allocator *pAVar1;
  string local_48;
  string_view local_28;
  StructuralParser *local_18;
  StructuralParser *this_local;
  
  pAVar1 = this->allocator;
  local_18 = this;
  Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>::
  readIdentifier_abi_cxx11_
            (&local_48,
             (Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
              *)this);
  local_28 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_48);
  this_local = (StructuralParser *)Identifier::Pool::get(&pAVar1->identifiers,local_28);
  std::__cxx11::string::~string((string *)&local_48);
  return (Identifier)(string *)this_local;
}

Assistant:

Identifier parseIdentifier()
    {
        return allocator.identifiers.get (readIdentifier());
    }